

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_debug.hpp
# Opt level: O0

void iutest::detail::iuDebugBreakAlloc(long n)

{
  long n_local;
  
  return;
}

Assistant:

static void IUTEST_ATTRIBUTE_UNUSED_ iuDebugBreakAlloc(long n)
{
#ifdef _IUTEST_DEBUG
#  if defined(_MSC_VER) && !defined(IUTEST_OS_WINDOWS_MOBILE)
    _CrtSetBreakAlloc(n);
#  endif
#endif
    (void)n;
}